

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void * __thiscall mpt::buffer::append(buffer *this,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  type_traits *ptVar3;
  size_t size;
  type_traits *traits;
  uint8_t *base;
  size_t avail;
  size_t used;
  size_t len_local;
  buffer *this_local;
  
  uVar1 = this->_used;
  if (this->_size - uVar1 < len) {
    this_local = (buffer *)0x0;
  }
  else {
    this_local = (buffer *)((long)&this[1]._vptr_buffer + uVar1);
    ptVar3 = content_traits(this);
    if ((ptVar3 == (type_traits *)0x0) ||
       (((uVar2 = ptVar3->size, uVar2 != 0 && (uVar1 % uVar2 == 0)) && (len % uVar2 == 0)))) {
      this->_used = len + this->_used;
    }
    else {
      this_local = (buffer *)0x0;
    }
  }
  return this_local;
}

Assistant:

void *buffer::append(size_t len)
{
	size_t used = _used;
	size_t avail = _size - used;
	if (len > avail) {
		return 0;
	}
	uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1)) + used;
	const struct type_traits *traits;
	if ((traits = content_traits())) {
		size_t size;
		if (!(size = traits->size)
		 || used % size
		 || len % size) {
			return 0;
		}
	}
	_used += len;
	return base;
}